

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code-generator.cpp
# Opt level: O0

void generateNative<true>(uint32_t nonce)

{
  ostream *this;
  uint32_t in_EDI;
  Program prog;
  uint8_t scratchpad [262144];
  uint8_t blockTemplate [76];
  uint64_t hash [8];
  Program *in_stack_fffffffffffbfce8;
  ostream *in_stack_fffffffffffbfcf0;
  void *in_stack_fffffffffffbfd78;
  size_t in_stack_fffffffffffbfd80;
  void *in_stack_fffffffffffbfd88;
  size_t in_stack_fffffffffffbfdd8;
  void *in_stack_fffffffffffbfde0;
  size_t in_stack_fffffffffffbfde8;
  void *in_stack_fffffffffffbfdf0;
  size_t in_stack_fffffffffffbfdf8;
  void *in_stack_fffffffffffbfe00;
  undefined1 local_98 [39];
  undefined1 auStack_71 [109];
  uint32_t local_4;
  
  local_4 = in_EDI;
  memcpy(local_98,blockTemplate_,0x4c);
  store32(auStack_71,local_4);
  blake2b(in_stack_fffffffffffbfe00,in_stack_fffffffffffbfdf8,in_stack_fffffffffffbfdf0,
          in_stack_fffffffffffbfde8,in_stack_fffffffffffbfde0,in_stack_fffffffffffbfdd8);
  fillAes1Rx4<true>(in_stack_fffffffffffbfd88,in_stack_fffffffffffbfd80,in_stack_fffffffffffbfd78);
  fillAes1Rx4<true>(in_stack_fffffffffffbfd88,in_stack_fffffffffffbfd80,in_stack_fffffffffffbfd78);
  this = defyx::operator<<(in_stack_fffffffffffbfcf0,in_stack_fffffffffffbfce8);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void generateNative(uint32_t nonce) {
	alignas(16) uint64_t hash[8];
	uint8_t blockTemplate[sizeof(blockTemplate_)];
	memcpy(blockTemplate, blockTemplate_, sizeof(blockTemplate));
	store32(blockTemplate + 39, nonce);
	blake2b(hash, sizeof(hash), blockTemplate, sizeof(blockTemplate), nullptr, 0);
	uint8_t scratchpad[defyx::ScratchpadSize];
	fillAes1Rx4<softAes>((void*)hash, defyx::ScratchpadSize, scratchpad);
	alignas(16) defyx::Program prog;
	fillAes1Rx4<softAes>((void*)hash, sizeof(prog), &prog);
	std::cout << prog << std::endl;
}